

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strongly_connected_components.cpp
# Opt level: O0

vector<std::unordered_set<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>,_std::allocator<std::unordered_set<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>_>_>
* handlegraph::algorithms::strongly_connected_components(HandleGraph *handle_graph)

{
  vector<std::unordered_set<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>,_std::allocator<std::unordered_set<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>_>_>
  *in_RDI;
  unordered_set<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>
  already_used;
  unordered_set<handlegraph::handle_t,_std::hash<handlegraph::handle_t>,_std::equal_to<handlegraph::handle_t>,_std::allocator<handlegraph::handle_t>_>
  on_stack;
  vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> stack;
  unordered_map<handlegraph::handle_t,_long,_std::hash<handlegraph::handle_t>,_std::equal_to<handlegraph::handle_t>,_std::allocator<std::pair<const_handlegraph::handle_t,_long>_>_>
  discover_idx;
  unordered_map<handlegraph::handle_t,_handlegraph::handle_t,_std::hash<handlegraph::handle_t>,_std::equal_to<handlegraph::handle_t>,_std::allocator<std::pair<const_handlegraph::handle_t,_handlegraph::handle_t>_>_>
  roots;
  int64_t index;
  vector<std::unordered_set<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>,_std::allocator<std::unordered_set<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>_>_>
  *components;
  anon_class_56_7_dd179aaa *in_stack_fffffffffffffd88;
  function<void_(const_handlegraph::handle_t_&)> *in_stack_fffffffffffffd90;
  vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> *this;
  vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> local_1e8;
  char *local_1c8;
  HandleGraph *local_1c0;
  unordered_set<handlegraph::handle_t,_std::hash<handlegraph::handle_t>,_std::equal_to<handlegraph::handle_t>,_std::allocator<handlegraph::handle_t>_>
  *local_1b8;
  undefined1 *local_1b0;
  undefined1 *local_1a8;
  undefined1 *local_1a0;
  unordered_set<handlegraph::handle_t,_std::hash<handlegraph::handle_t>,_std::equal_to<handlegraph::handle_t>,_std::allocator<handlegraph::handle_t>_>
  *sinks;
  vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> *sources;
  _Any_data *handle_end_fn;
  function<void_(const_handlegraph::handle_t_&)> *handle_begin_fn;
  HandleGraph *graph;
  undefined1 local_118 [63];
  byte local_d9;
  HandleGraph local_d8 [7];
  undefined1 local_a0 [80];
  unordered_set<handlegraph::handle_t,_std::hash<handlegraph::handle_t>,_std::equal_to<handlegraph::handle_t>,_std::allocator<handlegraph::handle_t>_>
  local_50;
  _Any_data local_18;
  
  local_18._M_unused._M_object = (void *)0x0;
  sinks = &local_50;
  std::
  unordered_map<handlegraph::handle_t,_handlegraph::handle_t,_std::hash<handlegraph::handle_t>,_std::equal_to<handlegraph::handle_t>,_std::allocator<std::pair<const_handlegraph::handle_t,_handlegraph::handle_t>_>_>
  ::unordered_map((unordered_map<handlegraph::handle_t,_handlegraph::handle_t,_std::hash<handlegraph::handle_t>,_std::equal_to<handlegraph::handle_t>,_std::allocator<std::pair<const_handlegraph::handle_t,_handlegraph::handle_t>_>_>
                   *)0x271e22);
  sources = (vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> *)
            (local_a0 + 0x18);
  std::
  unordered_map<handlegraph::handle_t,_long,_std::hash<handlegraph::handle_t>,_std::equal_to<handlegraph::handle_t>,_std::allocator<std::pair<const_handlegraph::handle_t,_long>_>_>
  ::unordered_map((unordered_map<handlegraph::handle_t,_long,_std::hash<handlegraph::handle_t>,_std::equal_to<handlegraph::handle_t>,_std::allocator<std::pair<const_handlegraph::handle_t,_long>_>_>
                   *)0x271e34);
  handle_begin_fn = (function<void_(const_handlegraph::handle_t_&)> *)local_a0;
  std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>::vector
            ((vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> *)0x271e46);
  graph = local_d8;
  std::
  unordered_set<handlegraph::handle_t,_std::hash<handlegraph::handle_t>,_std::equal_to<handlegraph::handle_t>,_std::allocator<handlegraph::handle_t>_>
  ::unordered_set((unordered_set<handlegraph::handle_t,_std::hash<handlegraph::handle_t>,_std::equal_to<handlegraph::handle_t>,_std::allocator<handlegraph::handle_t>_>
                   *)0x271e58);
  local_d9 = 0;
  std::
  vector<std::unordered_set<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>,_std::allocator<std::unordered_set<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>_>_>
  ::vector((vector<std::unordered_set<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>,_std::allocator<std::unordered_set<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>_>_>
            *)0x271e6a);
  std::
  unordered_set<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>
  ::unordered_set((unordered_set<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>
                   *)0x271e77);
  handle_end_fn = &local_18;
  std::function<void(handlegraph::handle_t_const&)>::
  function<handlegraph::algorithms::strongly_connected_components(handlegraph::HandleGraph_const*)::__0,void>
            (in_stack_fffffffffffffd90,(anon_class_40_5_e3f05e3e *)in_stack_fffffffffffffd88);
  local_1c8 = local_18._M_pod_data + 8;
  local_1c0 = local_d8;
  local_1b8 = &local_50;
  local_1b0 = local_a0 + 0x18;
  local_1a8 = local_a0;
  local_1a0 = local_118;
  std::function<void(handlegraph::handle_t_const&)>::
  function<handlegraph::algorithms::strongly_connected_components(handlegraph::HandleGraph_const*)::__1,void>
            (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  local_1e8.super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1e8.super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1e8.super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this = &local_1e8;
  std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>::vector
            ((vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> *)0x271f90);
  std::
  unordered_set<handlegraph::handle_t,_std::hash<handlegraph::handle_t>,_std::equal_to<handlegraph::handle_t>,_std::allocator<handlegraph::handle_t>_>
  ::unordered_set((unordered_set<handlegraph::handle_t,_std::hash<handlegraph::handle_t>,_std::equal_to<handlegraph::handle_t>,_std::allocator<handlegraph::handle_t>_>
                   *)0x271fc1);
  internal::dfs(graph,handle_begin_fn,
                (function<void_(const_handlegraph::handle_t_&)> *)handle_end_fn,sources,sinks);
  std::
  unordered_set<handlegraph::handle_t,_std::hash<handlegraph::handle_t>,_std::equal_to<handlegraph::handle_t>,_std::allocator<handlegraph::handle_t>_>
  ::~unordered_set((unordered_set<handlegraph::handle_t,_std::hash<handlegraph::handle_t>,_std::equal_to<handlegraph::handle_t>,_std::allocator<handlegraph::handle_t>_>
                    *)0x271ff1);
  std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>::~vector(this);
  std::function<void_(const_handlegraph::handle_t_&)>::~function
            ((function<void_(const_handlegraph::handle_t_&)> *)0x27200b);
  std::function<void_(const_handlegraph::handle_t_&)>::~function
            ((function<void_(const_handlegraph::handle_t_&)> *)0x272018);
  local_d9 = 1;
  std::
  unordered_set<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>
  ::~unordered_set((unordered_set<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>
                    *)0x27202d);
  if ((local_d9 & 1) == 0) {
    std::
    vector<std::unordered_set<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>,_std::allocator<std::unordered_set<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>_>_>
    ::~vector((vector<std::unordered_set<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>,_std::allocator<std::unordered_set<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>_>_>
               *)this);
  }
  std::
  unordered_set<handlegraph::handle_t,_std::hash<handlegraph::handle_t>,_std::equal_to<handlegraph::handle_t>,_std::allocator<handlegraph::handle_t>_>
  ::~unordered_set((unordered_set<handlegraph::handle_t,_std::hash<handlegraph::handle_t>,_std::equal_to<handlegraph::handle_t>,_std::allocator<handlegraph::handle_t>_>
                    *)0x272115);
  std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>::~vector(this);
  std::
  unordered_map<handlegraph::handle_t,_long,_std::hash<handlegraph::handle_t>,_std::equal_to<handlegraph::handle_t>,_std::allocator<std::pair<const_handlegraph::handle_t,_long>_>_>
  ::~unordered_map((unordered_map<handlegraph::handle_t,_long,_std::hash<handlegraph::handle_t>,_std::equal_to<handlegraph::handle_t>,_std::allocator<std::pair<const_handlegraph::handle_t,_long>_>_>
                    *)0x27212f);
  std::
  unordered_map<handlegraph::handle_t,_handlegraph::handle_t,_std::hash<handlegraph::handle_t>,_std::equal_to<handlegraph::handle_t>,_std::allocator<std::pair<const_handlegraph::handle_t,_handlegraph::handle_t>_>_>
  ::~unordered_map((unordered_map<handlegraph::handle_t,_handlegraph::handle_t,_std::hash<handlegraph::handle_t>,_std::equal_to<handlegraph::handle_t>,_std::allocator<std::pair<const_handlegraph::handle_t,_handlegraph::handle_t>_>_>
                    *)0x27213c);
  return in_RDI;
}

Assistant:

vector<unordered_set<nid_t>> strongly_connected_components(const HandleGraph* handle_graph) {
    
#ifdef debug
    cerr << "Computing strongly connected components" << endl;
#endif
    
    // What node visit step are we on?
    int64_t index = 0;
    // What's the search root from which a node was reached?
    unordered_map<handle_t, handle_t> roots;
    // At what index step was each node discovered?
    unordered_map<handle_t, int64_t> discover_idx;
    // We need our own copy of the DFS stack
    vector<handle_t> stack;
    // And our own set of nodes already on the stack
    unordered_set<handle_t> on_stack;
    // What components did we find? Because of the way strongly connected
    // components generalizes, both orientations of a node always end up in the
    // same component.
    vector<unordered_set<nid_t>> components;
    
    // A single node ID from each component we've already added, which we use
    // to deduplicate the results
    // TODO: why do we produce duplicate components in the first place?
    unordered_set<nid_t> already_used;
    
    handlegraph::algorithms::internal::dfs(*handle_graph,
        [&](const handle_t& trav) {
        // When a NodeTraversal is first visited
#ifdef debug
        cerr << "First visit to " << handle_graph->get_id(trav) << " orientation " << handle_graph->get_is_reverse(trav) << endl;
#endif
        // It is its own root
        roots[trav] = trav;
        // We discovered it at this step
        discover_idx[trav] = index++;
        // And it's on the stack
        stack.push_back(trav);
        on_stack.insert(trav);
    },
        [&](const handle_t& trav) {
        // When a NodeTraversal is done being recursed into
#ifdef debug
        cerr << "Finishing " << handle_graph->get_id(trav) << " orientation " << handle_graph->get_is_reverse(trav) << endl;
#endif
        // Go through all the NodeTraversals reachable reading onwards from this traversal.
        handle_graph->follow_edges(trav, false, [&](const handle_t& next) {
#ifdef debug
            cerr << "\tCould next reach " << handle_graph->get_id(next) << " orientation " << handle_graph->get_is_reverse(next) << endl;
#endif
            if (on_stack.count(next)) {
                // If any of those NodeTraversals are on the stack already
#ifdef debug
                cerr << "\t\tIt is already on the stack, so maybe we want its root" << endl;
#endif
                auto& node_root = roots[trav];
                auto& next_root = roots[next];
#ifdef debug
                cerr << "\t\t\tWe have root " << handle_graph->get_id(node_root) << " orientation "
                << handle_graph->get_is_reverse(node_root)
                << " discovered at time " << discover_idx[node_root] << endl;
                cerr << "\t\t\tThey have root " << handle_graph->get_id(next_root) << " orientation "
                << handle_graph->get_is_reverse(next_root)
                << " discovered at time " << discover_idx[next_root] << endl;
#endif
                // Adopt the root of the NodeTraversal that was discovered first.
                roots[trav] = discover_idx[node_root] < discover_idx[next_root] ?
                node_root : next_root;
#ifdef debug
                cerr << "\t\t\tWinning root: " << handle_graph->get_id(roots[trav]) << " orientation "
                << handle_graph->get_is_reverse(roots[trav]) << endl;
#endif
            }
            return true;
        });
        
        if (roots[trav] == trav) {
            // If we didn't find a better root
#ifdef debug
            cerr << "\tWe are our own best root, so glom up everything under us" << endl;
#endif
            handle_t other;
            bool is_duplicate = false;
            unordered_set<nid_t> component;
            do
            {
                // Grab everything that was put on the DFS stack below us
                // and put it in our component.
                other = stack.back();
                stack.pop_back();
                on_stack.erase(other);
                
                nid_t node_id = handle_graph->get_id(other);
                
                if (already_used.count(node_id)) {
                    is_duplicate = true;
                    break;
                }
                
                component.insert(node_id);
#ifdef debug
                cerr << "\t\tSnarf up node " << handle_graph->get_id(other) << " from handle in orientation "
                << handle_graph->get_is_reverse(other) << endl;
#endif
            } while (other != trav);
            
            if (!is_duplicate) {
                // use one node ID to mark this component as finished
                already_used.insert(*component.begin());
                // add it to the return valuse
                components.emplace_back(std::move(component));
            }
        }
    },
        vector<handle_t>(), unordered_set<handle_t>());
    
    return components;
}